

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseData<std::vector<int,std::allocator<int>>>::
resolve<std::vector<int,std::allocator<int>>>
          (PromiseData<std::vector<int,std::allocator<int>>> *this,
          vector<int,_std::allocator<int>_> *value)

{
  PromiseValue<std::vector<int,_std::allocator<int>_>_> local_28;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *value_local;
  PromiseData<std::vector<int,_std::allocator<int>_>_> *this_local;
  
  local_18 = value;
  value_local = (vector<int,_std::allocator<int>_> *)this;
  PromiseValue<std::vector<int,_std::allocator<int>_>_>::PromiseValue(&local_28,value);
  PromiseValue<std::vector<int,_std::allocator<int>_>_>::operator=
            ((PromiseValue<std::vector<int,_std::allocator<int>_>_> *)(this + 0x58),&local_28);
  PromiseValue<std::vector<int,_std::allocator<int>_>_>::~PromiseValue(&local_28);
  PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::setSettled((PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
                *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }